

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_unsignedByte(void)

{
  char cVar1;
  char cVar2;
  XSValue *pXVar3;
  wchar16 *pwVar4;
  char *pcVar5;
  long lVar6;
  void *pvVar7;
  char *pcVar8;
  int iVar9;
  bool bVar10;
  Status myStatus;
  char lex_v_ran_iv_2 [3];
  char lex_v_ran_v_2 [2];
  char lex_v_ran_iv_1 [5];
  Status myStatus_14;
  char lex_v_ran_v_2_canrep [2];
  char lex_v_ran_v_1 [5];
  char lex_v_ran_iv_2_canrep [3];
  char lex_iv_2 [8];
  char data_canrep_2 [4];
  char data_canrep_1 [4];
  char lex_v_ran_v_1_canrep [4];
  char lex_iv_1 [10];
  char lex_v_ran_iv_1_canrep [4];
  char data_rawstr_2 [7];
  char data_rawstr_1 [11];
  char lex_v_ran_v_0 [11];
  StrX local_c8;
  char *local_b8;
  char local_aa [4];
  char local_a6 [2];
  undefined4 local_a4;
  undefined1 local_a0;
  Status local_9c;
  char local_96 [2];
  undefined4 local_94;
  undefined1 local_90;
  char local_8c [4];
  char local_88 [12];
  char local_7c [4];
  undefined4 local_78;
  char local_74 [4];
  undefined8 local_70;
  undefined2 local_68;
  char local_60 [4];
  int local_5c;
  char local_58 [8];
  char local_50 [16];
  char local_40 [16];
  
  builtin_strncpy(local_40,"   123   \n",0xb);
  local_90 = 0;
  local_94 = 0x3535322b;
  local_a6[0] = '0';
  local_a6[1] = '\0';
  local_a0 = 0;
  local_a4 = 0x3635322b;
  local_aa[2] = 0;
  local_aa[0] = '-';
  local_aa[1] = '1';
  builtin_strncpy(local_74,"255",4);
  local_96[0] = '0';
  local_96[1] = '\0';
  builtin_strncpy(local_60,"256",4);
  local_8c[2] = 0;
  local_8c[0] = '-';
  local_8c[1] = '1';
  local_70 = 0x35342e3433623231;
  local_68 = 0x36;
  builtin_strncpy(local_88,"1234b56",8);
  builtin_strncpy(local_50,"   +123  \n",0xb);
  local_78 = 0x333231;
  builtin_strncpy(local_58,"000123",7);
  builtin_strncpy(local_7c,"123",4);
  local_b8 = (char *)((ulong)local_b8 & 0xffffffff00000000);
  local_c8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_c8.fUnicodeForm,dt_unsignedByte,(Status *)&local_b8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (cVar2 == '\0') {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xb9f,local_40,local_c8.fLocalForm,1);
    StrX::~StrX(&local_c8);
    errSeen = 1;
  }
  local_b8 = (char *)((ulong)local_b8 & 0xffffffff00000000);
  local_c8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_94,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_94,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_c8.fUnicodeForm,dt_unsignedByte,(Status *)&local_b8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (cVar2 == '\0') {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba0,&local_94,local_c8.fLocalForm,1);
    StrX::~StrX(&local_c8);
    errSeen = 1;
  }
  local_b8 = (char *)((ulong)local_b8 & 0xffffffff00000000);
  local_c8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_a6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_a6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_c8.fUnicodeForm,dt_unsignedByte,(Status *)&local_b8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (cVar2 == '\0') {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba1,local_a6,local_c8.fLocalForm,1);
    StrX::~StrX(&local_c8);
    errSeen = 1;
  }
  local_b8 = (char *)((ulong)local_b8 & 0xffffffff00000000);
  local_c8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_a4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_a4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_c8.fUnicodeForm,dt_unsignedByte,(Status *)&local_b8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (cVar2 == '\0') {
    if ((int)local_b8 != 6) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      if (((ulong)local_b8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_b8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xba4,&local_a4,local_c8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_0011b60f;
    }
  }
  else {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba4,&local_a4,local_c8.fLocalForm,0);
LAB_0011b60f:
    StrX::~StrX(&local_c8);
    errSeen = 1;
  }
  local_b8 = (char *)((ulong)local_b8 & 0xffffffff00000000);
  local_c8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_aa,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_aa,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_c8.fUnicodeForm,dt_unsignedByte,(Status *)&local_b8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (cVar2 == '\0') {
    if ((int)local_b8 != 6) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      if (((ulong)local_b8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_b8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xba5,local_aa,local_c8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_0011b703;
    }
  }
  else {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba5,local_aa,local_c8.fLocalForm,0);
LAB_0011b703:
    StrX::~StrX(&local_c8);
    errSeen = 1;
  }
  local_b8 = (char *)((ulong)local_b8 & 0xffffffff00000000);
  local_c8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_c8.fUnicodeForm,dt_unsignedByte,(Status *)&local_b8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (cVar2 == '\0') {
    if ((int)local_b8 != 6) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      if (((ulong)local_b8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_b8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xba8,&local_70,local_c8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_0011b7f7;
    }
  }
  else {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba8,&local_70,local_c8.fLocalForm,0);
LAB_0011b7f7:
    StrX::~StrX(&local_c8);
    errSeen = 1;
  }
  local_b8 = (char *)((ulong)local_b8 & 0xffffffff00000000);
  local_c8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_88,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_88,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_c8.fUnicodeForm,dt_unsignedByte,(Status *)&local_b8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (cVar2 == '\0') {
    if ((int)local_b8 != 6) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      if (((ulong)local_b8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_b8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xba9,local_88,local_c8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_0011b8eb;
    }
  }
  else {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba9,local_88,local_c8.fLocalForm,0);
LAB_0011b8eb:
    StrX::~StrX(&local_c8);
    errSeen = 1;
  }
  iVar9 = 1;
  do {
    local_b8 = (char *)((ulong)local_b8 & 0xffffffff00000000);
    local_5c = iVar9;
    local_c8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c8.fUnicodeForm,dt_unsignedByte,(Status *)&local_b8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbc6,local_40);
      StrX::~StrX(&local_c8);
      errSeen = 1;
    }
    else {
      pvVar7 = (void *)(ulong)(byte)pXVar3[8];
      if (pXVar3[8] != (XSValue)0x7b) {
        printf("ACTVALUE_TEST Unexpected dt_unsignedByte XSValue, got %d expected %d\n",pvVar7,0x7b)
        ;
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    iVar9 = local_5c;
    bVar10 = local_5c == 1;
    local_b8 = (char *)((ulong)local_b8 & 0xffffffff00000000);
    local_c8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_94,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_94,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c8.fUnicodeForm,dt_unsignedByte,(Status *)&local_b8,ver_10,bVar10,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbc8,&local_94);
      StrX::~StrX(&local_c8);
      errSeen = 1;
    }
    else {
      pvVar7 = (void *)(ulong)(byte)pXVar3[8];
      if (pXVar3[8] != (XSValue)0xff) {
        printf("ACTVALUE_TEST Unexpected dt_unsignedByte XSValue, got %d expected %d\n",pvVar7,0xff)
        ;
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_b8 = (char *)((ulong)local_b8 & 0xffffffff00000000);
    local_c8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_a6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_a6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c8.fUnicodeForm,dt_unsignedByte,(Status *)&local_b8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbc9,local_a6);
      StrX::~StrX(&local_c8);
      errSeen = 1;
    }
    else {
      pvVar7 = (void *)(ulong)(byte)pXVar3[8];
      if (pXVar3[8] != (XSValue)0x0) {
        printf("ACTVALUE_TEST Unexpected dt_unsignedByte XSValue, got %d expected %d\n",pvVar7,0);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_b8 = (char *)((ulong)local_b8 & 0xffffffff00000000);
    local_c8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_a4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_a4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c8.fUnicodeForm,dt_unsignedByte,(Status *)&local_b8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_b8 != 6) {
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_b8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_b8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xbca,&local_a4,local_c8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_c8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      pvVar7 = (void *)0xbca;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbca,&local_a4);
      StrX::~StrX(&local_c8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_b8 = (char *)((ulong)local_b8 & 0xffffffff00000000);
    local_c8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_aa,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_aa,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c8.fUnicodeForm,dt_unsignedByte,(Status *)&local_b8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_b8 != 6) {
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_b8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_b8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xbcb,local_aa,local_c8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_c8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      pvVar7 = (void *)0xbcb;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbcb,local_aa);
      StrX::~StrX(&local_c8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_b8 = (char *)((ulong)local_b8 & 0xffffffff00000000);
    local_c8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c8.fUnicodeForm,dt_unsignedByte,(Status *)&local_b8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_b8 != 6) {
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_b8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_b8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xbcd,&local_70,local_c8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_c8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      pvVar7 = (void *)0xbcd;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbcd,&local_70);
      StrX::~StrX(&local_c8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_b8 = (char *)((ulong)local_b8 & 0xffffffff00000000);
    local_c8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_88,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_88,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c8.fUnicodeForm,dt_unsignedByte,(Status *)&local_b8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_b8 != 6) {
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_b8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_b8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xbce,local_88,local_c8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_c8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      pvVar7 = (void *)0xbce;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbce,local_88);
      StrX::~StrX(&local_c8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    iVar9 = iVar9 + -1;
  } while (iVar9 == 0);
  iVar9 = 0;
  do {
    local_9c = st_Init;
    local_c8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_c8.fUnicodeForm,dt_unsignedByte,&local_9c,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbec,local_50);
      StrX::~StrX(&local_c8);
      errSeen = 1;
    }
    else {
      local_b8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = (char *)&local_78;
      if (local_b8 != pcVar8) {
        pcVar5 = local_b8;
        if (local_b8 == (char *)0x0) {
LAB_0011c0da:
          if (*pcVar8 == '\0') goto LAB_0011c124;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_0011c0da;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xbec,local_50,local_c8.fLocalForm,local_b8,&local_78);
        StrX::~StrX(&local_c8);
        errSeen = 1;
      }
LAB_0011c124:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_9c = st_Init;
    local_c8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_c8.fUnicodeForm,dt_unsignedByte,&local_9c,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbed,local_58);
      StrX::~StrX(&local_c8);
      errSeen = 1;
    }
    else {
      local_b8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_7c;
      if (local_b8 != pcVar8) {
        pcVar5 = local_b8;
        if (local_b8 == (char *)0x0) {
LAB_0011c21b:
          if (*pcVar8 == '\0') goto LAB_0011c265;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_0011c21b;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xbed,local_58,local_c8.fLocalForm,local_b8,local_7c);
        StrX::~StrX(&local_c8);
        errSeen = 1;
      }
LAB_0011c265:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_9c = st_Init;
    local_c8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_94,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_94,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_c8.fUnicodeForm,dt_unsignedByte,&local_9c,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbef,&local_94);
      StrX::~StrX(&local_c8);
      errSeen = 1;
    }
    else {
      local_b8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_74;
      if (local_b8 != pcVar8) {
        pcVar5 = local_b8;
        if (local_b8 == (char *)0x0) {
LAB_0011c35c:
          if (*pcVar8 == '\0') goto LAB_0011c3a6;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_0011c35c;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xbef,&local_94,local_c8.fLocalForm,local_b8,local_74);
        StrX::~StrX(&local_c8);
        errSeen = 1;
      }
LAB_0011c3a6:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_9c = st_Init;
    local_c8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_a6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_a6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_c8.fUnicodeForm,dt_unsignedByte,&local_9c,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbf0,local_a6);
      StrX::~StrX(&local_c8);
      errSeen = 1;
    }
    else {
      local_b8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_96;
      if (local_b8 != pcVar8) {
        pcVar5 = local_b8;
        if (local_b8 == (char *)0x0) {
LAB_0011c4a2:
          if (*pcVar8 == '\0') goto LAB_0011c4ec;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_0011c4a2;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xbf0,local_a6,local_c8.fLocalForm,local_b8,local_96);
        StrX::~StrX(&local_c8);
        errSeen = 1;
      }
LAB_0011c4ec:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_b8 = (char *)((ulong)local_b8 & 0xffffffff00000000);
    local_c8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_c8.fUnicodeForm,dt_unsignedByte,(Status *)&local_b8,ver_10,iVar9 == 0,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (lVar6 == 0) {
      if ((int)local_b8 != 6) {
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_b8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_b8 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xbf2,&local_70,local_c8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_c8);
        goto LAB_0011c606;
      }
    }
    else {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbf2,&local_70);
      StrX::~StrX(&local_c8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0011c606:
      errSeen = 1;
    }
    local_b8 = (char *)((ulong)local_b8 & 0xffffffff00000000);
    local_c8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_88,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_88,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_c8.fUnicodeForm,dt_unsignedByte,(Status *)&local_b8,ver_10,iVar9 == 0,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c8);
    if (lVar6 == 0) {
      if ((int)local_b8 != 6) {
        StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_b8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_b8 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xbf3,local_88,local_c8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_c8);
        goto LAB_0011c70e;
      }
    }
    else {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbf3,local_88);
      StrX::~StrX(&local_c8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0011c70e:
      errSeen = 1;
    }
    bVar10 = iVar9 == 0;
    iVar9 = iVar9 + 1;
  } while (bVar10);
  local_b8 = (char *)((ulong)local_b8 & 0xffffffff00000000);
  local_c8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_a4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_a4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_c8.fUnicodeForm,dt_unsignedByte,(Status *)&local_b8,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (lVar6 == 0) {
    if ((int)local_b8 != 6) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      if (((ulong)local_b8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_b8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xbf8,&local_a4,local_c8.fLocalForm,"st_FOCA0002",pcVar8);
      StrX::~StrX(&local_c8);
      goto LAB_0011c829;
    }
  }
  else {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xbf8,&local_a4);
    StrX::~StrX(&local_c8);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0011c829:
    errSeen = 1;
  }
  local_b8 = (char *)((ulong)local_b8 & 0xffffffff00000000);
  local_c8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_aa,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_aa,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_c8.fUnicodeForm,dt_unsignedByte,(Status *)&local_b8,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (lVar6 == 0) {
    if ((int)local_b8 != 6) {
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      if (((ulong)local_b8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_b8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xbf9,local_aa,local_c8.fLocalForm,"st_FOCA0002",pcVar8);
      StrX::~StrX(&local_c8);
      goto LAB_0011c934;
    }
  }
  else {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xbf9,local_aa);
    StrX::~StrX(&local_c8);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0011c934:
    errSeen = 1;
  }
  local_9c = st_Init;
  local_c8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_a4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_a4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar4 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_c8.fUnicodeForm,dt_unsignedByte,&local_9c,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (pwVar4 == (wchar16 *)0x0) {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xbfc,&local_a4);
    StrX::~StrX(&local_c8);
    errSeen = 1;
  }
  else {
    local_b8 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar8 = local_60;
    if (local_b8 != pcVar8) {
      pcVar5 = local_b8;
      if (local_b8 == (char *)0x0) {
LAB_0011ca0e:
        if (*pcVar8 == '\0') goto LAB_0011ca5a;
      }
      else {
        do {
          cVar2 = *pcVar5;
          if (cVar2 == '\0') goto LAB_0011ca0e;
          pcVar5 = pcVar5 + 1;
          cVar1 = *pcVar8;
          pcVar8 = pcVar8 + 1;
        } while (cVar2 == cVar1);
      }
      StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xbfc,&local_a4,local_c8.fLocalForm,local_b8,local_60);
      StrX::~StrX(&local_c8);
      errSeen = 1;
    }
LAB_0011ca5a:
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
    xercesc_4_0::XMLString::release(&local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  local_9c = st_Init;
  local_c8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_aa,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_aa,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar4 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_c8.fUnicodeForm,dt_unsignedByte,&local_9c,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  if (pwVar4 == (wchar16 *)0x0) {
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xbfd,local_aa,local_c8.fLocalForm);
    StrX::~StrX(&local_c8);
    errSeen = 1;
    return;
  }
  local_b8 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pcVar8 = local_8c;
  if (local_b8 != pcVar8) {
    pcVar5 = local_b8;
    if (local_b8 == (char *)0x0) {
LAB_0011cb48:
      if (*pcVar8 == '\0') goto LAB_0011cb94;
    }
    else {
      do {
        cVar2 = *pcVar5;
        if (cVar2 == '\0') goto LAB_0011cb48;
        pcVar5 = pcVar5 + 1;
        cVar1 = *pcVar8;
        pcVar8 = pcVar8 + 1;
      } while (cVar2 == cVar1);
    }
    StrX::StrX(&local_c8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
           ,0xbfd,local_aa,local_c8.fLocalForm,local_b8,local_8c);
    StrX::~StrX(&local_c8);
    errSeen = 1;
  }
LAB_0011cb94:
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
  xercesc_4_0::XMLString::release(&local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return;
}

Assistant:

void test_dt_unsignedByte()
{
    const XSValue::DataType dt = XSValue::dt_unsignedByte;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="   123   \n";

    const char lex_v_ran_v_1[]="+255";
    const char lex_v_ran_v_2[]="0";
    const char lex_v_ran_iv_1[]="+256";
    const char lex_v_ran_iv_2[]="-1";

    XSValue::XSValue_Data act_v_ran_v_0;  act_v_ran_v_0.fValue.f_uchar = (unsigned char)123;
    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_uchar = (unsigned char)+255;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_uchar = (unsigned char)0;

    const char lex_v_ran_v_1_canrep[]="255";
    const char lex_v_ran_v_2_canrep[]="0";
    const char lex_v_ran_iv_1_canrep[]="256";
    const char lex_v_ran_iv_2_canrep[]="-1";

    const char lex_iv_1[]="12b34.456";
    const char lex_iv_2[]="1234b56";

/***
 * 3.3.24.2 Canonical representation
 *
 * The canonical representation for unsignedByte is defined by prohibiting certain options from the
 * Lexical representation (3.3.24.1). Specifically,
 * 1. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="   +123  \n";
    const char data_canrep_1[]="123";
    const char data_rawstr_2[]="000123";
    const char data_canrep_2[]="123";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, valid range
    VALIDATE_TEST(lex_v_ran_v_0  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, invalid range
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_0);

        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid                            XMLCh         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_1_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_2_canrep,  DONT_CARE);

        CANREP_TEST(lex_iv_1        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

    }

    //validation on
    CANREP_TEST(lex_v_ran_iv_1, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
    CANREP_TEST(lex_v_ran_iv_2, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    //validation off
    CANREP_TEST(lex_v_ran_iv_1, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep, DONT_CARE);
    CANREP_TEST(lex_v_ran_iv_2, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep, DONT_CARE);
}